

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_hash_table_val_equal(void *val1_p,void *val2_p,int mod,void *UNUSED_cb_data)

{
  LYS_NODE LVar1;
  lyd_node *node1;
  lyd_node *node2;
  int iVar2;
  lyd_node *val2;
  lyd_node *val1;
  void *UNUSED_cb_data_local;
  int mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  node1 = *val1_p;
  node2 = *val2_p;
  if (mod == 0) {
    if (node1->schema == node2->schema) {
      LVar1 = node1->schema->nodetype;
      if ((LVar1 != LYS_CONTAINER) && (LVar1 != LYS_LEAF)) {
        if ((LVar1 == LYS_LEAFLIST) || (LVar1 == LYS_LIST)) {
          iVar2 = lyd_list_equal(node1,node2,0);
          return iVar2;
        }
        if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) {
          ly_log(node1->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x13d);
          return 0;
        }
      }
      val1_p_local._4_4_ = 1;
    }
    else {
      val1_p_local._4_4_ = 0;
    }
  }
  else if (node1 == node2) {
    val1_p_local._4_4_ = 1;
  }
  else {
    val1_p_local._4_4_ = 0;
  }
  return val1_p_local._4_4_;
}

Assistant:

static int
lyd_hash_table_val_equal(void *val1_p, void *val2_p, int mod, void *UNUSED(cb_data))
{
    struct lyd_node *val1, *val2;

    val1 = *((struct lyd_node **)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (mod) {
        if (val1 == val2) {
            return 1;
        } else {
            return 0;
        }
    }

    if (val1->schema != val2->schema) {
        return 0;
    }

    switch (val1->schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return 1;
    case LYS_LEAFLIST:
    case LYS_LIST:
        return lyd_list_equal(val1, val2, 0);
    default:
        break;
    }

    LOGINT(val1->schema->module->ctx);
    return 0;
}